

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<char[12]> *bVal)

{
  ChNameValue<char[12]> local_30;
  ChNameValue<char[12]> *local_18;
  ChNameValue<char[12]> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<char[12]> *)this;
  ChNameValue<char[12]>::ChNameValue(&local_30,bVal);
  out<char,12ul>(this,&local_30);
  ChNameValue<char[12]>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }